

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# completion_handler.hpp
# Opt level: O1

void asio::detail::
     completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.cpp:1335:26),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  function<void_()> *pfVar1;
  _Manager_type p_Var2;
  undefined8 uVar3;
  ptr p;
  anon_class_80_4_80d670d3_for_handler_ handler;
  ptr local_78;
  anon_class_80_4_80d670d3_for_handler_ local_60;
  
  local_60.me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)base[1].next_;
  pfVar1 = &local_60.fetch_more;
  local_60.me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)base[1].func_;
  base[1].func_ = (func_type)0x0;
  base[1].next_ = (scheduler_operation *)0x0;
  local_60.data.
  super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)&base[1].task_result_;
  local_60.data.
  super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)base[2].next_;
  base[2].next_ = (scheduler_operation *)0x0;
  *(undefined8 *)&base[1].task_result_ = 0;
  local_60.file.super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)base[2].func_;
  local_60.file.super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&base[2].task_result_;
  *(undefined8 *)&base[2].task_result_ = 0;
  base[2].func_ = (func_type)0x0;
  local_60.fetch_more.super__Function_base._M_manager = (_Manager_type)0x0;
  local_60.fetch_more.super__Function_base._M_functor._M_unused._M_object =
       (scheduler_operation *)0x0;
  local_60.fetch_more.super__Function_base._M_functor._8_8_ = (func_type)0x0;
  local_60.fetch_more._M_invoker = (_Invoker_type)base[4].next_;
  p_Var2 = *(_Manager_type *)&base[3].task_result_;
  if (p_Var2 != (_Manager_type)0x0) {
    local_60.fetch_more.super__Function_base._M_functor._M_unused._M_object = base[3].next_;
    local_60.fetch_more.super__Function_base._M_functor._8_8_ = base[3].func_;
    *(undefined8 *)&base[3].task_result_ = 0;
    base[4].next_ = (scheduler_operation *)0x0;
    local_60.fetch_more.super__Function_base._M_manager = p_Var2;
  }
  local_78.h = &local_60;
  local_78.v = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:1335:26),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                *)base;
  local_78.p = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:1335:26),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                *)base;
  ptr::reset(&local_78);
  if (owner != (void *)0x0) {
    if (local_60.fetch_more.super__Function_base._M_manager == (_Manager_type)0x0) {
      uVar3 = std::__throw_bad_function_call();
      __clang_call_terminate(uVar3);
    }
    (*local_60.fetch_more._M_invoker)(pfVar1);
    std::ostream::write(&(local_60.file.
                          super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->field_0x10,
                        (long)((local_60.data.
                                super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                              super__Vector_impl_data._M_start);
  }
  if (local_60.fetch_more.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_60.fetch_more.super__Function_base._M_manager)
              ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
  }
  if (local_60.file.super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_60.file.
               super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((scheduler_operation *)
      local_60.data.
      super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (scheduler_operation *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_60.data.
               super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_60.me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_60.me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  ptr::reset(&local_78);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    completion_handler* h(static_cast<completion_handler*>(base));
    ptr p = { asio::detail::addressof(h->handler_), h, h };

    ASIO_HANDLER_COMPLETION((*h));

    // Take ownership of the operation's outstanding work.
    handler_work<Handler, IoExecutor> w(
        ASIO_MOVE_CAST2(handler_work<Handler, IoExecutor>)(
          h->work_));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    Handler handler(ASIO_MOVE_CAST(Handler)(h->handler_));
    p.h = asio::detail::addressof(handler);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN(());
      w.complete(handler, handler);
      ASIO_HANDLER_INVOCATION_END;
    }
  }